

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O3

uint32_t __thiscall
choc::text::FloatToStringBuffer<double>::generateDigits
          (FloatToStringBuffer<double> *this,char *buffer,MantissaAndExponent upperBound,
          uint64_t mantissaDiff,uint64_t delta,int *K)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint32_t *puVar13;
  bool bVar14;
  
  uVar2 = upperBound._8_8_;
  bVar3 = -(char)upperBound.mantissa;
  uVar4 = 1L << (bVar3 & 0x3f);
  uVar11 = (ulong)buffer >> (bVar3 & 0x3f);
  uVar9 = (uint)uVar11;
  if (uVar9 < 1000) {
    iVar5 = 1;
    if (uVar9 < 10) goto LAB_001e3459;
    bVar14 = uVar9 < 100;
    iVar5 = 3;
  }
  else if (uVar9 < 1000000) {
    iVar5 = 4;
    if (uVar9 < 10000) goto LAB_001e3459;
    bVar14 = uVar9 < 100000;
    iVar5 = 6;
  }
  else if (uVar9 < 100000000) {
    bVar14 = uVar9 < 10000000;
    iVar5 = 8;
  }
  else {
    bVar14 = uVar9 < 1000000000;
    iVar5 = 10;
  }
  iVar5 = iVar5 - (uint)bVar14;
LAB_001e3459:
  uVar7 = (ulong)buffer & uVar4 - 1;
  uVar9 = 0;
  do {
    iVar5 = iVar5 + -1;
    iVar10 = (int)uVar11;
    switch(iVar5) {
    case 0:
      uVar11 = 0;
      goto LAB_001e354f;
    case 1:
      iVar1 = (int)((uVar11 & 0xffffffff) / 10);
      iVar8 = (int)((uVar11 & 0xffffffff) / 10) * 10;
      break;
    case 2:
      iVar1 = (int)((uVar11 & 0xffffffff) / 100);
      iVar8 = (int)((uVar11 & 0xffffffff) / 100) * 100;
      break;
    case 3:
      iVar1 = (int)((uVar11 & 0xffffffff) / 1000);
      iVar8 = (int)((uVar11 & 0xffffffff) / 1000) * 1000;
      break;
    case 4:
      iVar1 = (int)((uVar11 & 0xffffffff) / 10000);
      iVar8 = (int)((uVar11 & 0xffffffff) / 10000) * 10000;
      break;
    case 5:
      uVar11 = uVar11 >> 5 & 0x7ffffff;
      iVar1 = (int)(uVar11 / 0xc35);
      iVar8 = (int)(uVar11 / 0xc35) * 100000;
      break;
    case 6:
      iVar1 = (int)((uVar11 & 0xffffffff) / 1000000);
      iVar8 = (int)((uVar11 & 0xffffffff) / 1000000) * 1000000;
      break;
    case 7:
      iVar1 = (int)((uVar11 & 0xffffffff) / 10000000);
      iVar8 = (int)((uVar11 & 0xffffffff) / 10000000) * 10000000;
      break;
    case 8:
      iVar1 = (int)((uVar11 & 0xffffffff) / 100000000);
      iVar8 = (int)((uVar11 & 0xffffffff) / 100000000) * 100000000;
      break;
    default:
      uVar11 = uVar11 & 0xffffffff;
      goto LAB_001e354f;
    }
    uVar11 = (ulong)(uint)(iVar10 - iVar8);
    iVar10 = iVar1;
LAB_001e354f:
    uVar6 = 0;
    if (iVar10 != 0 || uVar9 != 0) {
      this->storage[uVar9] = (char)iVar10 + '0';
      uVar6 = uVar9 + 1;
    }
    uVar9 = uVar6;
    uVar12 = (uVar11 << (bVar3 & 0x3f)) + uVar7;
    if (uVar12 <= mantissaDiff) {
      *(int *)delta = *(int *)delta + iVar5;
      uVar4 = (ulong)powersOf10[iVar5] << (bVar3 & 0x3f);
      if (uVar2 <= uVar12) {
        return uVar9;
      }
      if (uVar4 <= mantissaDiff - uVar12) {
        uVar11 = uVar2 - uVar12;
        uVar12 = uVar12 + uVar4;
        uVar7 = mantissaDiff - uVar12;
        do {
          if ((uVar2 <= uVar12) && (uVar11 <= uVar12 - uVar2)) {
            return uVar9;
          }
          this->storage[uVar9 - 1] = this->storage[uVar9 - 1] + -1;
          bVar14 = uVar4 <= uVar7;
          uVar7 = uVar7 - uVar4;
          if (uVar2 <= uVar12) {
            return uVar9;
          }
          uVar11 = uVar11 - uVar4;
          uVar12 = uVar12 + uVar4;
        } while (bVar14);
        return uVar9;
      }
      return uVar9;
    }
    if (iVar5 == 0) {
      puVar13 = powersOf10;
      iVar5 = 1;
      do {
        uVar11 = mantissaDiff;
        uVar12 = uVar7 * 10 >> (bVar3 & 0x3f);
        uVar6 = 0;
        if ((int)uVar12 != 0 || uVar9 != 0) {
          uVar6 = uVar9 + 1;
          this->storage[uVar9] = (char)uVar12 + '0';
        }
        mantissaDiff = uVar11 * 10;
        uVar7 = uVar7 * 10 & uVar4 - 1;
        puVar13 = puVar13 + 1;
        iVar5 = iVar5 + -1;
        uVar9 = uVar6;
      } while (mantissaDiff < uVar7 || mantissaDiff - uVar7 == 0);
      *(int *)delta = *(int *)delta + iVar5 + -1;
      if ((-8 < iVar5) && (uVar4 <= mantissaDiff - uVar7)) {
        uVar2 = *puVar13 * uVar2;
        uVar12 = uVar2 - uVar7;
        if (uVar7 <= uVar2 && uVar12 != 0) {
          uVar7 = uVar7 + uVar4;
          uVar11 = uVar11 * 10 - uVar7;
          do {
            if ((uVar2 <= uVar7) && (uVar12 <= uVar7 - uVar2)) {
              return uVar6;
            }
            this->storage[uVar6 - 1] = this->storage[uVar6 - 1] + -1;
            bVar14 = uVar4 <= uVar11;
            uVar11 = uVar11 - uVar4;
            if (uVar2 <= uVar7) {
              return uVar6;
            }
            uVar12 = uVar12 - uVar4;
            uVar7 = uVar7 + uVar4;
          } while (bVar14);
        }
      }
      return uVar6;
    }
  } while( true );
}

Assistant:

static uint32_t generateDigits (char* buffer, MantissaAndExponent upperBound, uint64_t mantissaDiff, uint64_t delta, int& K)
    {
        uint32_t length = 0;
        const auto one = MantissaAndExponent { 1ull << -upperBound.exponent, upperBound.exponent };
        auto p1 = static_cast<uint32_t> (upperBound.mantissa >> -one.exponent);
        auto p2 = upperBound.mantissa & (one.mantissa - 1);
        auto numDigits = math::getNumDecimalDigits (p1);

        for (;;)
        {
            auto digit = p1;

            switch (--numDigits)
            {
                case 0:                           p1 = 0;              break;
                case 1:  digit /= powersOf10[1];  p1 %= powersOf10[1]; break;
                case 2:  digit /= powersOf10[2];  p1 %= powersOf10[2]; break;
                case 3:  digit /= powersOf10[3];  p1 %= powersOf10[3]; break;
                case 4:  digit /= powersOf10[4];  p1 %= powersOf10[4]; break;
                case 5:  digit /= powersOf10[5];  p1 %= powersOf10[5]; break;
                case 6:  digit /= powersOf10[6];  p1 %= powersOf10[6]; break;
                case 7:  digit /= powersOf10[7];  p1 %= powersOf10[7]; break;
                case 8:  digit /= powersOf10[8];  p1 %= powersOf10[8]; break;
                default: break;
            }

            writeDigitIfNotLeadingZero (buffer, length, digit);
            auto rest = p2 + (static_cast<uint64_t> (p1) << -one.exponent);

            if (rest <= delta)
            {
                K += numDigits;
                roundFinalDigit (buffer, length, delta, rest, static_cast<uint64_t> (powersOf10[numDigits]) << -one.exponent, mantissaDiff);
                return length;
            }

            if (numDigits == 0)
            {
                for (;;)
                {
                    delta *= 10;
                    p2 *= 10;
                    --numDigits;
                    writeDigitIfNotLeadingZero (buffer, length, static_cast<uint32_t> (p2 >> -one.exponent));
                    p2 &= one.mantissa - 1;

                    if (p2 < delta)
                    {
                        K += numDigits;
                        roundFinalDigit (buffer, length, delta, p2, one.mantissa, numDigits > -9 ? mantissaDiff * powersOf10[-numDigits] : 0);
                        return length;
                    }
                }
            }
        }
    }